

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O1

int gray_raster_render(FT_Raster raster,FT_Raster_Params *params)

{
  FT_Outline *outline;
  FT_Bitmap *pFVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  gray_TWorker_ local_1a8;
  undefined1 local_40 [8];
  FT_BBox cbox;
  
  if (raster == (FT_Raster)0x0) {
    return 6;
  }
  if ((params->flags & 1U) == 0) {
    return 0x13;
  }
  outline = (FT_Outline *)params->source;
  if (outline == (FT_Outline *)0x0) {
    return 0x14;
  }
  if ((outline->n_points != 0) && (0 < outline->n_contours)) {
    if (outline->contours == (short *)0x0) {
      return 0x14;
    }
    if (outline->points == (FT_Vector *)0x0) {
      return 0x14;
    }
    if (outline->contours[(int)outline->n_contours - 1] + 1 != (int)outline->n_points) {
      return 0x14;
    }
    pFVar1 = params->target;
    local_1a8.outline.flags = outline->flags;
    local_1a8.outline._36_4_ = *(undefined4 *)&outline->field_0x24;
    local_1a8.outline.n_contours = outline->n_contours;
    local_1a8.outline.n_points = outline->n_points;
    local_1a8.outline._4_4_ = *(undefined4 *)&outline->field_0x4;
    local_1a8.outline.points = outline->points;
    local_1a8.outline.tags = outline->tags;
    local_1a8.outline.contours = outline->contours;
    if ((params->flags & 2U) == 0) {
      if (pFVar1 == (FT_Bitmap *)0x0) {
        return 6;
      }
      if (pFVar1->width == 0) {
        return 0;
      }
      if (pFVar1->rows == 0) {
        return 0;
      }
      if (pFVar1->buffer == (uchar *)0x0) {
        return 6;
      }
      local_1a8.target.pitch = pFVar1->pitch;
      uVar2 = 0;
      if (-1 < local_1a8.target.pitch) {
        uVar2 = (pFVar1->rows - 1) * local_1a8.target.pitch;
      }
      local_1a8.target.origin = pFVar1->buffer + uVar2;
      local_1a8.render_span = (FT_SpanFunc)0x0;
      local_1a8.render_span_data = (void *)0x0;
    }
    else {
      local_1a8.render_span = params->gray_spans;
      if (local_1a8.render_span == (FT_SpanFunc)0x0) {
        return 0;
      }
      local_1a8.render_span_data = params->user;
    }
    FT_Outline_Get_CBox(outline,(FT_BBox *)local_40);
    if ((0x1000000 < cbox.xMax || 0x1000000 < cbox.yMin) ||
        (cbox.xMin < -0x1000000 || (long)local_40 < -0x1000000)) {
      return 0x14;
    }
    local_40 = (undefined1  [8])((long)local_40 >> 6);
    cbox.xMin = cbox.xMin >> 6;
    cbox.yMin = cbox.yMin + 0x3f >> 6;
    cbox.xMax = cbox.xMax + 0x3f >> 6;
    if ((params->flags & 2U) == 0) {
      uVar5 = (ulong)pFVar1->rows;
      uVar4 = (ulong)pFVar1->width;
      FVar6 = 0;
      FVar7 = 0;
    }
    else if ((params->flags & 4U) == 0) {
      FVar6 = -0x8000;
      uVar5 = 0x7fff;
      uVar4 = 0x7fff;
      FVar7 = -0x8000;
    }
    else {
      FVar7 = (params->clip_box).xMin;
      FVar6 = (params->clip_box).yMin;
      uVar4 = (params->clip_box).xMax;
      uVar5 = (params->clip_box).yMax;
    }
    if (FVar7 < (long)local_40) {
      FVar7 = (FT_Pos)local_40;
    }
    local_1a8.min_ex = (TCoord)FVar7;
    if (FVar6 < cbox.xMin) {
      FVar6 = cbox.xMin;
    }
    local_1a8.min_ey = (TCoord)FVar6;
    if (cbox.yMin < (long)uVar4) {
      uVar4 = cbox.yMin;
    }
    local_1a8.max_ex = (TCoord)uVar4;
    if (cbox.xMax < (long)uVar5) {
      uVar5 = cbox.xMax;
    }
    local_1a8.max_ey = (TCoord)uVar5;
    if (local_1a8.min_ex < local_1a8.max_ex) {
      if (local_1a8.min_ey < local_1a8.max_ey) {
        iVar3 = gray_convert_glyph(&local_1a8);
        return iVar3;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int
  gray_raster_render( FT_Raster                raster,
                      const FT_Raster_Params*  params )
  {
    const FT_Outline*  outline    = (const FT_Outline*)params->source;
    const FT_Bitmap*   target_map = params->target;
    FT_BBox            cbox, clip;

#ifndef FT_STATIC_RASTER
    gray_TWorker  worker[1];
#endif


    if ( !raster )
      return FT_THROW( Invalid_Argument );

    /* this version does not support monochrome rendering */
    if ( !( params->flags & FT_RASTER_FLAG_AA ) )
      return FT_THROW( Invalid_Mode );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    /* return immediately if the outline is empty */
    if ( outline->n_points == 0 || outline->n_contours <= 0 )
      return 0;

    if ( !outline->contours || !outline->points )
      return FT_THROW( Invalid_Outline );

    if ( outline->n_points !=
           outline->contours[outline->n_contours - 1] + 1 )
      return FT_THROW( Invalid_Outline );

    ras.outline = *outline;

    if ( params->flags & FT_RASTER_FLAG_DIRECT )
    {
      if ( !params->gray_spans )
        return 0;

      ras.render_span      = (FT_Raster_Span_Func)params->gray_spans;
      ras.render_span_data = params->user;
    }
    else
    {
      /* if direct mode is not set, we must have a target bitmap */
      if ( !target_map )
        return FT_THROW( Invalid_Argument );

      /* nothing to do */
      if ( !target_map->width || !target_map->rows )
        return 0;

      if ( !target_map->buffer )
        return FT_THROW( Invalid_Argument );

      if ( target_map->pitch < 0 )
        ras.target.origin = target_map->buffer;
      else
        ras.target.origin = target_map->buffer
              + ( target_map->rows - 1 ) * (unsigned int)target_map->pitch;

      ras.target.pitch = target_map->pitch;

      ras.render_span      = (FT_Raster_Span_Func)NULL;
      ras.render_span_data = NULL;
    }

    FT_Outline_Get_CBox( outline, &cbox );

    /* reject too large outline coordinates */
    if ( cbox.xMin < -0x1000000L || cbox.xMax > 0x1000000L ||
         cbox.yMin < -0x1000000L || cbox.yMax > 0x1000000L )
      return FT_THROW( Invalid_Outline );

    /* truncate the bounding box to integer pixels */
    cbox.xMin = cbox.xMin >> 6;
    cbox.yMin = cbox.yMin >> 6;
    cbox.xMax = ( cbox.xMax + 63 ) >> 6;
    cbox.yMax = ( cbox.yMax + 63 ) >> 6;

    /* compute clipping box */
    if ( !( params->flags & FT_RASTER_FLAG_DIRECT ) )
    {
      /* compute clip box from target pixmap */
      clip.xMin = 0;
      clip.yMin = 0;
      clip.xMax = (FT_Pos)target_map->width;
      clip.yMax = (FT_Pos)target_map->rows;
    }
    else if ( params->flags & FT_RASTER_FLAG_CLIP )
      clip = params->clip_box;
    else
    {
      clip.xMin = -32768L;
      clip.yMin = -32768L;
      clip.xMax =  32767L;
      clip.yMax =  32767L;
    }

    /* clip to target bitmap, exit if nothing to do */
    ras.min_ex = FT_MAX( cbox.xMin, clip.xMin );
    ras.min_ey = FT_MAX( cbox.yMin, clip.yMin );
    ras.max_ex = FT_MIN( cbox.xMax, clip.xMax );
    ras.max_ey = FT_MIN( cbox.yMax, clip.yMax );

    if ( ras.max_ex <= ras.min_ex || ras.max_ey <= ras.min_ey )
      return 0;

    return gray_convert_glyph( RAS_VAR );
  }